

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O2

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException(MismatchedTokenException *this)

{
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Mismatched Token: expecting any AST node",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"<AST>",&local_62);
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_40,&local_60,-1,-1);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedTokenException_00222db0;
  (this->token).ref = (TokenRef *)0x0;
  ASTRefCount<antlr::AST>::ASTRefCount(&this->node,(AST *)0x0);
  (this->tokenText)._M_dataplus._M_p = (pointer)&(this->tokenText).field_2;
  (this->tokenText)._M_string_length = 0;
  (this->tokenText).field_2._M_local_buf[0] = '\0';
  BitSet::BitSet(&this->set,0x40);
  this->tokenNames = (char **)0x0;
  this->numTokens = 0;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException()
  : RecognitionException("Mismatched Token: expecting any AST node","<AST>",-1,-1)
  , token(0)
  , node(nullASTptr)
  , tokenNames(0)
  , numTokens(0)
{
}